

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O2

ByteData256 * __thiscall
cfd::core::TapBranch::GetBranchHash
          (ByteData256 *__return_storage_ptr__,TapBranch *this,uint8_t depth)

{
  bool bVar1;
  int iVar2;
  HashUtil *pHVar3;
  byte bVar4;
  pointer this_00;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  ByteData tapbranch_base;
  undefined1 local_98 [40];
  HashUtil hasher;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  GetBaseHash(__return_storage_ptr__,this);
  if ((this->branch_list_).
      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->branch_list_).
      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (GetBranchHash(unsigned_char)::kTaggedHash == '\0') {
      iVar2 = __cxa_guard_acquire(&GetBranchHash(unsigned_char)::kTaggedHash);
      if (iVar2 != 0) {
        ::std::__cxx11::string::string((string *)&hasher,"TapBranch",(allocator *)local_98);
        HashUtil::Sha256(&GetBranchHash::kTaggedHash,(string *)&hasher);
        ::std::__cxx11::string::~string((string *)&hasher);
        __cxa_atexit(ByteData256::~ByteData256,&GetBranchHash::kTaggedHash,&__dso_handle);
        __cxa_guard_release(&GetBranchHash(unsigned_char)::kTaggedHash);
      }
    }
    ByteData256::Concat<cfd::core::ByteData256>
              (&tapbranch_base,&GetBranchHash::kTaggedHash,&GetBranchHash::kTaggedHash);
    (*this->_vptr_TapBranch[4])(&nodes,this);
    this_00 = nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (bVar4 = 0;
        (this_00 !=
         nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
         _M_impl.super__Vector_impl_data._M_finish && (bVar4 <= depth)); bVar4 = bVar4 + 1) {
      HashUtil::HashUtil((HashUtil *)local_98,'\x03');
      pHVar3 = HashUtil::operator<<((HashUtil *)local_98,&tapbranch_base);
      HashUtil::HashUtil(&hasher,pHVar3);
      HashUtil::~HashUtil((HashUtil *)local_98);
      ByteData256::GetBytes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,this_00);
      ByteData256::GetBytes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e0,
                 __return_storage_ptr__);
      bVar1 = ::std::__lexicographical_compare<true>::__lc<unsigned_char,unsigned_char>
                        (local_e0._M_impl.super__Vector_impl_data._M_start,
                         local_e0._M_impl.super__Vector_impl_data._M_finish,(uchar *)local_98._0_8_,
                         (uchar *)local_98._8_8_);
      if (bVar1) {
        pHVar3 = HashUtil::operator<<(&hasher,__return_storage_ptr__);
        pHVar3 = HashUtil::operator<<(pHVar3,this_00);
        HashUtil::Output256((ByteData256 *)&local_48,pHVar3);
      }
      else {
        pHVar3 = HashUtil::operator<<(&hasher,this_00);
        pHVar3 = HashUtil::operator<<(pHVar3,__return_storage_ptr__);
        HashUtil::Output256((ByteData256 *)&local_48,pHVar3);
      }
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
                 &local_48);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_e0);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
      HashUtil::~HashUtil(&hasher);
      this_00 = this_00 + 1;
    }
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&nodes);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tapbranch_base);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData256 TapBranch::GetBranchHash(uint8_t depth) const {
  ByteData256 hash = GetBaseHash();
  if (branch_list_.empty()) return hash;

  static auto kTaggedHash = HashUtil::Sha256("TapBranch");
  ByteData tapbranch_base = kTaggedHash.Concat(kTaggedHash);
  auto nodes = GetNodeList();
  uint8_t index = 0;
  for (const auto& node : nodes) {
    if (index > depth) break;
    auto hasher = HashUtil(HashUtil::kSha256) << tapbranch_base;
    const auto& node_bytes = node.GetBytes();
    const auto& hash_bytes = hash.GetBytes();
    if (std::lexicographical_compare(
            hash_bytes.begin(), hash_bytes.end(), node_bytes.begin(),
            node_bytes.end())) {
      hash = (hasher << hash << node).Output256();
    } else {
      hash = (hasher << node << hash).Output256();
    }
    ++index;
  }
  return hash;
}